

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astUseNamedSlotsOfNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  anon_struct_8_1_115700ab gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.usedTuple = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 1;
  local_30 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_48);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  gcFrame.usedTuple =
       sysbvm_interpreter_evaluateASTWithEnvironment
                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_48);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUseNamedSlotsOfNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astUseNamedSlotsOfNode_t **useNode = (sysbvm_astUseNamedSlotsOfNode_t**)node;

    struct {
        sysbvm_tuple_t usedTuple;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*useNode)->super.sourcePosition);

    gcFrame.usedTuple = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*useNode)->tupleExpression, *environment);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return SYSBVM_VOID_TUPLE;
}